

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

_Bool Curl_bufq_peek(bufq *q,uchar **pbuf,size_t *plen)

{
  ulong uVar1;
  _Bool _Var2;
  buf_chunk *pbVar3;
  size_t sVar4;
  
  pbVar3 = q->head;
  if (pbVar3 != (buf_chunk *)0x0) {
    if (pbVar3->w_offset <= pbVar3->r_offset) {
      prune_head(q);
      pbVar3 = q->head;
      if (pbVar3 == (buf_chunk *)0x0) goto LAB_00512923;
    }
    uVar1 = pbVar3->r_offset;
    sVar4 = pbVar3->w_offset - uVar1;
    if (uVar1 <= pbVar3->w_offset && sVar4 != 0) {
      *pbuf = (pbVar3->x).data + uVar1;
      _Var2 = true;
      goto LAB_0051292b;
    }
  }
LAB_00512923:
  *pbuf = (uchar *)0x0;
  sVar4 = 0;
  _Var2 = false;
LAB_0051292b:
  *plen = sVar4;
  return _Var2;
}

Assistant:

bool Curl_bufq_peek(struct bufq *q,
                    const unsigned char **pbuf, size_t *plen)
{
  if(q->head && chunk_is_empty(q->head)) {
    prune_head(q);
  }
  if(q->head && !chunk_is_empty(q->head)) {
    chunk_peek(q->head, pbuf, plen);
    return TRUE;
  }
  *pbuf = NULL;
  *plen = 0;
  return FALSE;
}